

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O3

void bson_meta(lua_State *L)

{
  int iVar1;
  luaL_Reg l [3];
  luaL_Reg local_48;
  char *local_38;
  code *pcStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar1 = luaL_newmetatable(L,"bson");
  if (iVar1 != 0) {
    local_28 = 0;
    uStack_20 = 0;
    local_38 = "makeindex";
    pcStack_30 = lmakeindex;
    local_48.name = "decode";
    local_48.func = ldecode;
    luaL_checkversion_(L,503.0,0x88);
    lua_createtable(L,0,2);
    luaL_setfuncs(L,&local_48,0);
    lua_setfield(L,-2,"__index");
    lua_pushcclosure(L,ltostring,0);
    lua_setfield(L,-2,"__tostring");
    lua_pushcclosure(L,llen,0);
    lua_setfield(L,-2,"__len");
    lua_pushcclosure(L,lreplace,0);
    lua_setfield(L,-2,"__newindex");
  }
  lua_setmetatable(L,-2);
  return;
}

Assistant:

static void
bson_meta(lua_State *L) {
	if (luaL_newmetatable(L, "bson")) {
		luaL_Reg l[] = {
			{ "decode", ldecode },
			{ "makeindex", lmakeindex },
			{ NULL, NULL },
		};
		luaL_newlib(L,l);
		lua_setfield(L, -2, "__index");
		lua_pushcfunction(L, ltostring);
		lua_setfield(L, -2, "__tostring");
		lua_pushcfunction(L, llen);
		lua_setfield(L, -2, "__len");
		lua_pushcfunction(L, lreplace);
		lua_setfield(L, -2, "__newindex");
	}
	lua_setmetatable(L, -2);
}